

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureMipmapTests.cpp
# Opt level: O1

int __thiscall
deqp::gles3::Functional::Texture2DLodControlCase::init
          (Texture2DLodControlCase *this,EVP_PKEY_CTX *ctx)

{
  uint width;
  uint height;
  pointer pPVar1;
  int extraout_EAX;
  int extraout_EAX_00;
  int iVar2;
  Texture2D *this_00;
  ulong uVar3;
  long lVar4;
  uint uVar5;
  int levelNdx;
  uint uVar6;
  deUint32 step;
  Vec4 local_40;
  
  width = this->m_texWidth;
  height = this->m_texHeight;
  uVar5 = height;
  if ((int)height < (int)width) {
    uVar5 = width;
  }
  if (uVar5 == 0) {
    uVar6 = 0x20;
  }
  else {
    uVar6 = 0x1f;
    if (uVar5 != 0) {
      for (; uVar5 >> uVar6 == 0; uVar6 = uVar6 - 1) {
      }
    }
    uVar6 = uVar6 ^ 0x1f;
  }
  this_00 = (Texture2D *)operator_new(0x70);
  glu::Texture2D::Texture2D
            (this_00,((this->super_TestCase).m_context)->m_renderCtx,0x8058,width,height);
  this->m_texture = this_00;
  iVar2 = extraout_EAX;
  if (uVar5 != 0) {
    uVar3 = (ulong)(0x1f - uVar6);
    if ((int)(0x1f - uVar6) < 1) {
      uVar3 = 0;
    }
    lVar4 = 0;
    levelNdx = 0;
    do {
      tcu::Texture2D::allocLevel(&this->m_texture->m_refTexture,levelNdx);
      pPVar1 = (this->m_texture->m_refTexture).super_TextureLevelPyramid.m_access.
               super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>.
               _M_impl.super__Vector_impl_data._M_start;
      tcu::RGBA::toVec((RGBA *)&local_40);
      tcu::clear((PixelBufferAccess *)
                 ((long)(pPVar1->super_ConstPixelBufferAccess).m_size.m_data + lVar4 + -8),&local_40
                );
      levelNdx = levelNdx + 1;
      lVar4 = lVar4 + 0x28;
      iVar2 = extraout_EAX_00;
    } while (uVar3 * 0x28 + 0x28 != lVar4);
  }
  return iVar2;
}

Assistant:

void Texture2DLodControlCase::init (void)
{
	const deUint32	format		= GL_RGBA8;
	int				numLevels	= deLog2Floor32(de::max(m_texWidth, m_texHeight))+1;

	m_texture = new glu::Texture2D(m_context.getRenderContext(), format, m_texWidth, m_texHeight);

	// Fill texture with colored grid.
	for (int levelNdx = 0; levelNdx < numLevels; levelNdx++)
	{
		deUint32	step		= 0xff / (numLevels-1);
		deUint32	inc			= deClamp32(step*levelNdx, 0x00, 0xff);
		deUint32	dec			= 0xff - inc;
		deUint32	rgb			= (inc << 16) | (dec << 8) | 0xff;
		deUint32	color		= 0xff000000 | rgb;

		m_texture->getRefTexture().allocLevel(levelNdx);
		tcu::clear(m_texture->getRefTexture().getLevel(levelNdx), tcu::RGBA(color).toVec());
	}
}